

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_cleanup(CURLM *m)

{
  uint_tbl *tbl;
  Curl_easy *pCVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  CURLMcode CVar4;
  Curl_multi *multi;
  int iVar5;
  uint mid;
  Curl_easy *data;
  void *entry;
  uint local_44;
  Curl_easy *local_40;
  Curl_easy *local_38;
  
  CVar4 = CURLM_BAD_HANDLE;
  if (((m != (CURLM *)0x0) && (CVar4 = CURLM_BAD_HANDLE, *m == 0xbab1e)) &&
     (CVar4 = CURLM_RECURSIVE_API_CALL, (*(byte *)((long)m + 0x271) & 4) == 0)) {
    tbl = (uint_tbl *)((long)m + 8);
    _Var3 = Curl_uint_tbl_first(tbl,&local_44,&local_38);
    if (_Var3) {
      do {
        local_40 = local_38;
        iVar5 = 1;
        if ((local_38 != (Curl_easy *)0x0) && (local_38->magic == 0xc0dedbad)) {
          if (local_38 == *(Curl_easy **)((long)m + 0x78)) {
            iVar5 = 3;
          }
          else {
            if ((((local_38->state).field_0x7bf & 0x10) == 0) &&
               (local_38->conn != (connectdata *)0x0)) {
              multi_done(local_38,CURLE_OK,true);
            }
            local_40->multi = (Curl_multi *)0x0;
            Curl_uint_tbl_remove(tbl,local_44);
            local_40->mid = 0xffffffff;
            if (local_40->psl == (PslCache *)((long)m + 0xd8)) {
              local_40->psl = (PslCache *)0x0;
            }
            iVar5 = 0;
            if (((local_40->state).field_0x7c0 & 0x10) != 0) {
              Curl_close(&local_40);
            }
          }
        }
        if ((iVar5 != 3) && (iVar5 != 0)) {
          return CURLM_BAD_HANDLE;
        }
        _Var3 = Curl_uint_tbl_next(tbl,local_44,&local_44,&local_38);
      } while (_Var3);
    }
    Curl_cpool_destroy((cpool *)((long)m + 0x1b8));
    Curl_cshutdn_destroy((cshutdn *)((long)m + 0x188),*(Curl_easy **)((long)m + 0x78));
    pCVar1 = *(Curl_easy **)((long)m + 0x78);
    if (pCVar1 != (Curl_easy *)0x0) {
      if ((((pCVar1->set).field_0x89f & 0x40) != 0) &&
         (((pcVar2 = (pCVar1->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)
           ) && (0 < Curl_trc_feat_multi.log_level)))) {
        Curl_trc_multi(pCVar1,"multi_cleanup, closing admin handle, done");
      }
      pCVar1 = *(Curl_easy **)((long)m + 0x78);
      pCVar1->multi = (Curl_multi *)0x0;
      Curl_uint_tbl_remove(tbl,pCVar1->mid);
      Curl_close((Curl_easy **)((long)m + 0x78));
    }
    *(undefined4 *)m = 0;
    Curl_multi_ev_cleanup((Curl_multi *)m);
    Curl_hash_destroy((Curl_hash *)((long)m + 0x158));
    Curl_dnscache_destroy((Curl_dnscache *)((long)m + 0xa0));
    Curl_psl_destroy((PslCache *)((long)m + 0xd8));
    Curl_ssl_scache_destroy(*(Curl_ssl_scache **)((long)m + 0xd0));
    close(*(int *)((long)m + 0x260));
    multi_xfer_bufs_free((Curl_multi *)m);
    Curl_uint_bset_destroy((uint_bset *)((long)m + 0x28));
    Curl_uint_bset_destroy((uint_bset *)((long)m + 0x38));
    Curl_uint_bset_destroy((uint_bset *)((long)m + 0x48));
    Curl_uint_tbl_destroy(tbl);
    (*Curl_cfree)(m);
    CVar4 = CURLM_OK;
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_cleanup(CURLM *m)
{
  struct Curl_multi *multi = m;
  if(GOOD_MULTI_HANDLE(multi)) {
    void *entry;
    unsigned int mid;
    if(multi->in_callback)
      return CURLM_RECURSIVE_API_CALL;

    /* First remove all remaining easy handles,
     * close internal ones. admin handle is special */
    if(Curl_uint_tbl_first(&multi->xfers, &mid, &entry)) {
      do {
        struct Curl_easy *data = entry;
        if(!GOOD_EASY_HANDLE(data))
          return CURLM_BAD_HANDLE;

#ifdef DEBUGBUILD
        if(mid != data->mid) {
          CURL_TRC_M(data, "multi_cleanup: still present with mid=%u, "
                  "but unexpected data->mid=%u\n", mid, data->mid);
          DEBUGASSERT(0);
        }
#endif

        if(data == multi->admin)
          continue;

        if(!data->state.done && data->conn)
          /* if DONE was never called for this handle */
          (void)multi_done(data, CURLE_OK, TRUE);

        data->multi = NULL; /* clear the association */
        Curl_uint_tbl_remove(&multi->xfers, mid);
        data->mid = UINT_MAX;

#ifdef USE_LIBPSL
        if(data->psl == &multi->psl)
          data->psl = NULL;
#endif
        if(data->state.internal)
          Curl_close(&data);
      }
      while(Curl_uint_tbl_next(&multi->xfers, mid, &mid, &entry));
    }

    Curl_cpool_destroy(&multi->cpool);
    Curl_cshutdn_destroy(&multi->cshutdn, multi->admin);
    if(multi->admin) {
      CURL_TRC_M(multi->admin, "multi_cleanup, closing admin handle, done");
      multi->admin->multi = NULL;
      Curl_uint_tbl_remove(&multi->xfers, multi->admin->mid);
      Curl_close(&multi->admin);
    }

    multi->magic = 0; /* not good anymore */

    Curl_multi_ev_cleanup(multi);
    Curl_hash_destroy(&multi->proto_hash);
    Curl_dnscache_destroy(&multi->dnscache);
    Curl_psl_destroy(&multi->psl);
    Curl_ssl_scache_destroy(multi->ssl_scache);

#ifdef USE_WINSOCK
    WSACloseEvent(multi->wsa_event);
#else
#ifdef ENABLE_WAKEUP
    wakeup_close(multi->wakeup_pair[0]);
#ifndef USE_EVENTFD
    wakeup_close(multi->wakeup_pair[1]);
#endif
#endif
#endif

    multi_xfer_bufs_free(multi);
#ifdef DEBUGBUILD
    if(Curl_uint_tbl_count(&multi->xfers)) {
      multi_xfer_tbl_dump(multi);
      DEBUGASSERT(0);
    }
#endif
    Curl_uint_bset_destroy(&multi->process);
    Curl_uint_bset_destroy(&multi->pending);
    Curl_uint_bset_destroy(&multi->msgsent);
    Curl_uint_tbl_destroy(&multi->xfers);
    free(multi);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}